

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

void elf_lzma_range_normalize
               (uchar *compressed,size_t compressed_size,size_t *poffset,uint32_t *prange,
               uint32_t *pcode)

{
  uint32_t *pcode_local;
  uint32_t *prange_local;
  size_t *poffset_local;
  size_t compressed_size_local;
  uchar *compressed_local;
  
  if (*prange < 0x1000000) {
    if (*poffset < compressed_size) {
      *prange = *prange << 8;
      *pcode = *pcode << 8;
      *pcode = (uint)compressed[*poffset] + *pcode;
      *poffset = *poffset + 1;
    }
    else {
      elf_uncompress_failed();
    }
  }
  return;
}

Assistant:

static void
elf_lzma_range_normalize (const unsigned char *compressed,
			  size_t compressed_size, size_t *poffset,
			  uint32_t *prange, uint32_t *pcode)
{
  if (*prange < (1U << 24))
    {
      if (unlikely (*poffset >= compressed_size))
	{
	  /* We assume this will be caught elsewhere.  */
	  elf_uncompress_failed ();
	  return;
	}
      *prange <<= 8;
      *pcode <<= 8;
      *pcode += compressed[*poffset];
      ++*poffset;
    }
}